

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  cmMakefile *this_00;
  undefined8 this_01;
  pointer pbVar1;
  bool bVar2;
  Encoding EVar3;
  string *psVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined1 uVar7;
  ulong uVar8;
  pointer __lhs;
  undefined1 local_518 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&ruleFileStream,(string *)psVar4);
  std::__cxx11::string::append((char *)&ruleFileStream);
  std::__cxx11::string::append((char *)&ruleFileStream);
  bVar2 = cmMakefile::ReadListFile(this_00,(string *)&ruleFileStream);
  if (bVar2) {
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    std::__cxx11::string::~string((string *)&ruleFileStream);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_FORCE_UNIX_PATHS",
                 (allocator<char> *)&internalRuleFileStream);
      pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar5 != (char *)0x0) {
        bVar2 = cmSystemTools::IsOff(pcVar5);
        if (!bVar2) {
          cmSystemTools::s_ForceUnixPaths = true;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_SOURCE",
                 (allocator<char> *)&internalRuleFileStream);
      pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar5 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)&ruleFileStream,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopSource((cmStateDirectory *)&ruleFileStream,pcVar5);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_BINARY",
                 (allocator<char> *)&internalRuleFileStream);
      pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar5 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)&ruleFileStream,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)&ruleFileStream,pcVar5);
      }
      goto LAB_002bc663;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&ruleFileStream);
  }
  cmSystemTools::Error("Directory Information file not found",(char *)0x0,(char *)0x0,(char *)0x0);
LAB_002bc663:
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(&ruleFileStream,dependFile,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              (&internalRuleFileStream,internalDependFile,false,EVar3);
    bVar2 = ((&internalRuleFileStream.super_ofstream.
               super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)internalRuleFileStream.super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
    uVar8 = CONCAT71((int7)((ulong)&ruleFileStream >> 8),bVar2);
    if (bVar2) {
      WriteDisclaimer(this,(ostream *)&ruleFileStream);
      WriteDisclaimer(this,(ostream *)&internalRuleFileStream);
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_518 + 0x10),"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)local_518
                );
      local_518._12_4_ = (undefined4)uVar8;
      psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)(local_518 + 0x10));
      cmSystemTools::ExpandListArgument(psVar4,&langs,false);
      std::__cxx11::string::~string((string *)(local_518 + 0x10));
      pbVar1 = langs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__lhs = langs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
        bVar2 = std::operator==(__lhs,"C");
        if (bVar2) {
LAB_002bc7c0:
          local_518._0_8_ = this;
          std::
          make_unique<cmDependsC,cmLocalUnixMakefileGenerator3*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,cmDepends::DependencyVector,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDepends::DependencyVector>>>*>
                    ((cmLocalUnixMakefileGenerator3 **)(local_518 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518,
                     targetDir,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                      **)__lhs);
LAB_002bc7e6:
          this_01 = local_508[0]._M_allocated_capacity;
          if ((cmDepends *)local_508[0]._0_8_ != (cmDepends *)0x0) {
            *(cmLocalUnixMakefileGenerator3 **)(local_508[0]._M_allocated_capacity + 8) = this;
            *(cmFileTimeCache **)(local_508[0]._M_allocated_capacity + 0x18) =
                 ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                 CMakeInstance->FileTimeCache;
            std::__cxx11::string::_M_assign((string *)(local_508[0]._M_allocated_capacity + 0x20));
            std::__cxx11::string::_M_assign((string *)(this_01 + 0x40));
            cmDepends::Write((cmDepends *)this_01,(ostream *)&ruleFileStream,
                             (ostream *)&internalRuleFileStream);
            (**(code **)(*(long *)this_01 + 8))(this_01);
          }
        }
        else {
          bVar2 = std::operator==(__lhs,"CXX");
          if (bVar2) goto LAB_002bc7c0;
          bVar2 = std::operator==(__lhs,"RC");
          if (bVar2) goto LAB_002bc7c0;
          bVar2 = std::operator==(__lhs,"ASM");
          if (bVar2) goto LAB_002bc7c0;
          bVar2 = std::operator==(__lhs,"CUDA");
          if (bVar2) goto LAB_002bc7c0;
          bVar2 = std::operator==(__lhs,"Fortran");
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&ruleFileStream,
                                     "# Note that incremental build could trigger ");
            std::operator<<(poVar6,"a call to cmake_copy_f90_mod on each re-build\n");
            local_518._0_8_ = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)(local_518 + 0x10));
            goto LAB_002bc7e6;
          }
          bVar2 = std::operator==(__lhs,"Java");
          if (bVar2) {
            std::make_unique<cmDependsJava>();
            goto LAB_002bc7e6;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&langs);
      uVar8 = (ulong)(uint)local_518._12_4_;
    }
    uVar7 = (undefined1)uVar8;
    cmGeneratedFileStream::~cmGeneratedFileStream(&internalRuleFileStream);
  }
  else {
    uVar7 = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  return (bool)uVar7;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile,
  std::map<std::string, cmDepends::DependencyVector>& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccuredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(
    mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"), langs);
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}